

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error processXmlDecl(XML_Parser parser,int isGeneralTextEntity,char *s,char *next)

{
  ENCODING *pEVar1;
  XML_Char *pXVar2;
  XML_Bool XVar3;
  int iVar4;
  XML_Error XVar5;
  code *pcVar6;
  STRING_POOL *pSVar7;
  int local_74;
  XML_Error result;
  int standalone;
  XML_Char *storedversion;
  char *versionend;
  char *version;
  ENCODING *newEncoding;
  XML_Char *storedEncName;
  char *encodingName;
  char *next_local;
  char *s_local;
  XML_Parser pXStack_28;
  int isGeneralTextEntity_local;
  XML_Parser parser_local;
  
  storedEncName = (XML_Char *)0x0;
  newEncoding = (ENCODING *)0x0;
  version = (char *)0x0;
  versionend = (char *)0x0;
  storedversion = (XML_Char *)0x0;
  _result = (XML_Char *)0x0;
  local_74 = -1;
  encodingName = next;
  next_local = s;
  s_local._4_4_ = isGeneralTextEntity;
  pXStack_28 = parser;
  XVar3 = accountingDiffTolerated(parser,0xc,s,next,0x1113,XML_ACCOUNT_DIRECT);
  if (XVar3 == '\0') {
    accountingOnAbort(pXStack_28);
    parser_local._4_4_ = XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
  }
  else {
    pcVar6 = coda_XmlParseXmlDecl;
    if (pXStack_28->m_ns != '\0') {
      pcVar6 = coda_XmlParseXmlDeclNS;
    }
    iVar4 = (*pcVar6)(s_local._4_4_,pXStack_28->m_encoding,next_local,encodingName,
                      &pXStack_28->m_eventPtr,&versionend,&storedversion,&storedEncName,&version,
                      &local_74);
    pXVar2 = storedEncName;
    if (iVar4 == 0) {
      if (s_local._4_4_ == 0) {
        parser_local._4_4_ = XML_ERROR_XML_DECL;
      }
      else {
        parser_local._4_4_ = XML_ERROR_TEXT_DECL;
      }
    }
    else {
      if (((s_local._4_4_ == 0) && (local_74 == 1)) &&
         (pXStack_28->m_dtd->standalone = '\x01',
         pXStack_28->m_paramEntityParsing == XML_PARAM_ENTITY_PARSING_UNLESS_STANDALONE)) {
        pXStack_28->m_paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
      }
      if (pXStack_28->m_xmlDeclHandler == (XML_XmlDeclHandler)0x0) {
        if (pXStack_28->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_28,pXStack_28->m_encoding,next_local,encodingName);
        }
      }
      else {
        if (storedEncName != (XML_Char *)0x0) {
          pSVar7 = &pXStack_28->m_temp2Pool;
          pEVar1 = pXStack_28->m_encoding;
          iVar4 = (*pXStack_28->m_encoding->nameLength)(pXStack_28->m_encoding,storedEncName);
          newEncoding = (ENCODING *)poolStoreString(pSVar7,pEVar1,pXVar2,pXVar2 + iVar4);
          if (newEncoding == (ENCODING *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          (pXStack_28->m_temp2Pool).start = (pXStack_28->m_temp2Pool).ptr;
        }
        if ((versionend != (char *)0x0) &&
           (_result = poolStoreString(&pXStack_28->m_temp2Pool,pXStack_28->m_encoding,versionend,
                                      storedversion + -(long)pXStack_28->m_encoding->minBytesPerChar
                                     ), _result == (XML_Char *)0x0)) {
          return XML_ERROR_NO_MEMORY;
        }
        (*pXStack_28->m_xmlDeclHandler)
                  (pXStack_28->m_handlerArg,_result,(XML_Char *)newEncoding,local_74);
      }
      pXVar2 = storedEncName;
      if (pXStack_28->m_protocolEncodingName == (XML_Char *)0x0) {
        if (version == (char *)0x0) {
          if (storedEncName != (XML_Char *)0x0) {
            if (newEncoding == (ENCODING *)0x0) {
              pSVar7 = &pXStack_28->m_temp2Pool;
              pEVar1 = pXStack_28->m_encoding;
              iVar4 = (*pXStack_28->m_encoding->nameLength)(pXStack_28->m_encoding,storedEncName);
              newEncoding = (ENCODING *)poolStoreString(pSVar7,pEVar1,pXVar2,pXVar2 + iVar4);
              if (newEncoding == (ENCODING *)0x0) {
                return XML_ERROR_NO_MEMORY;
              }
            }
            XVar5 = handleUnknownEncoding(pXStack_28,(XML_Char *)newEncoding);
            poolClear(&pXStack_28->m_temp2Pool);
            if (XVar5 != XML_ERROR_UNKNOWN_ENCODING) {
              return XVar5;
            }
            pXStack_28->m_eventPtr = storedEncName;
            return XML_ERROR_UNKNOWN_ENCODING;
          }
        }
        else {
          if ((*(int *)(version + 0x80) != pXStack_28->m_encoding->minBytesPerChar) ||
             ((*(int *)(version + 0x80) == 2 && ((ENCODING *)version != pXStack_28->m_encoding)))) {
            pXStack_28->m_eventPtr = storedEncName;
            return XML_ERROR_INCORRECT_ENCODING;
          }
          pXStack_28->m_encoding = (ENCODING *)version;
        }
      }
      if ((newEncoding != (ENCODING *)0x0) || (_result != (XML_Char *)0x0)) {
        poolClear(&pXStack_28->m_temp2Pool);
      }
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error
processXmlDecl(XML_Parser parser, int isGeneralTextEntity, const char *s,
               const char *next) {
  const char *encodingName = NULL;
  const XML_Char *storedEncName = NULL;
  const ENCODING *newEncoding = NULL;
  const char *version = NULL;
  const char *versionend = NULL;
  const XML_Char *storedversion = NULL;
  int standalone = -1;

#if XML_GE == 1
  if (! accountingDiffTolerated(parser, XML_TOK_XML_DECL, s, next, __LINE__,
                                XML_ACCOUNT_DIRECT)) {
    accountingOnAbort(parser);
    return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
  }
#endif

  if (! (parser->m_ns ? XmlParseXmlDeclNS : XmlParseXmlDecl)(
          isGeneralTextEntity, parser->m_encoding, s, next, &parser->m_eventPtr,
          &version, &versionend, &encodingName, &newEncoding, &standalone)) {
    if (isGeneralTextEntity)
      return XML_ERROR_TEXT_DECL;
    else
      return XML_ERROR_XML_DECL;
  }
  if (! isGeneralTextEntity && standalone == 1) {
    parser->m_dtd->standalone = XML_TRUE;
#ifdef XML_DTD
    if (parser->m_paramEntityParsing
        == XML_PARAM_ENTITY_PARSING_UNLESS_STANDALONE)
      parser->m_paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif /* XML_DTD */
  }
  if (parser->m_xmlDeclHandler) {
    if (encodingName != NULL) {
      storedEncName = poolStoreString(
          &parser->m_temp2Pool, parser->m_encoding, encodingName,
          encodingName + XmlNameLength(parser->m_encoding, encodingName));
      if (! storedEncName)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&parser->m_temp2Pool);
    }
    if (version) {
      storedversion
          = poolStoreString(&parser->m_temp2Pool, parser->m_encoding, version,
                            versionend - parser->m_encoding->minBytesPerChar);
      if (! storedversion)
        return XML_ERROR_NO_MEMORY;
    }
    parser->m_xmlDeclHandler(parser->m_handlerArg, storedversion, storedEncName,
                             standalone);
  } else if (parser->m_defaultHandler)
    reportDefault(parser, parser->m_encoding, s, next);
  if (parser->m_protocolEncodingName == NULL) {
    if (newEncoding) {
      /* Check that the specified encoding does not conflict with what
       * the parser has already deduced.  Do we have the same number
       * of bytes in the smallest representation of a character?  If
       * this is UTF-16, is it the same endianness?
       */
      if (newEncoding->minBytesPerChar != parser->m_encoding->minBytesPerChar
          || (newEncoding->minBytesPerChar == 2
              && newEncoding != parser->m_encoding)) {
        parser->m_eventPtr = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      parser->m_encoding = newEncoding;
    } else if (encodingName) {
      enum XML_Error result;
      if (! storedEncName) {
        storedEncName = poolStoreString(
            &parser->m_temp2Pool, parser->m_encoding, encodingName,
            encodingName + XmlNameLength(parser->m_encoding, encodingName));
        if (! storedEncName)
          return XML_ERROR_NO_MEMORY;
      }
      result = handleUnknownEncoding(parser, storedEncName);
      poolClear(&parser->m_temp2Pool);
      if (result == XML_ERROR_UNKNOWN_ENCODING)
        parser->m_eventPtr = encodingName;
      return result;
    }
  }

  if (storedEncName || storedversion)
    poolClear(&parser->m_temp2Pool);

  return XML_ERROR_NONE;
}